

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

void __thiscall HEkkDual::minorChooseRow(HEkkDual *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  this->multi_iChoice = -1;
  if (0 < (long)this->multi_num) {
    pdVar6 = &this->multi_choice[0].infeasEdWt;
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      if ((-1 < ((MChoice *)(pdVar6 + -5))->row_out) &&
         (dVar1 = pdVar6[-1], dVar2 = *pdVar6, dVar9 < dVar1 / dVar2)) {
        this->multi_iChoice = (HighsInt)lVar7;
        dVar9 = dVar1 / dVar2;
      }
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 0x49;
    } while (this->multi_num != lVar7);
  }
  this->row_out = -1;
  lVar7 = (long)this->multi_iChoice;
  if (lVar7 != -1) {
    iVar3 = this->multi_choice[lVar7].row_out;
    this->row_out = iVar3;
    iVar4 = (this->ekk_instance_->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar3];
    this->variable_out = iVar4;
    dVar9 = this->multi_choice[lVar7].baseValue;
    dVar1 = this->multi_choice[lVar7].baseLower;
    uVar8 = -(ulong)(dVar9 < dVar1);
    dVar9 = dVar9 - (double)(~uVar8 & (ulong)this->multi_choice[lVar7].baseUpper |
                            (ulong)dVar1 & uVar8);
    this->delta_primal = dVar9;
    this->move_out = (uint)(0.0 <= dVar9) * 2 + -1;
    iVar5 = this->multi_nFinish;
    this->multi_finish[iVar5].row_out = iVar3;
    this->multi_finish[iVar5].variable_out = iVar4;
    this->multi_finish[iVar5].row_ep = &this->multi_choice[lVar7].row_ep;
    this->multi_finish[iVar5].col_aq = &this->multi_choice[lVar7].col_aq;
    this->multi_finish[iVar5].col_BFRT = &this->multi_choice[lVar7].col_BFRT;
    this->multi_finish[iVar5].EdWt = this->multi_choice[lVar7].infeasEdWt;
    this->multi_choice[lVar7].row_out = -1;
  }
  return;
}

Assistant:

void HEkkDual::minorChooseRow() {
  /**
   * 1. Find which to go out
   *        Because we had other checking code
   *        We know current best is OK to be used
   */
  multi_iChoice = -1;
  double bestMerit = 0;
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    const HighsInt iRow = multi_choice[ich].row_out;
    if (iRow < 0) continue;
    double infeasValue = multi_choice[ich].infeasValue;
    double infeasEdWt = multi_choice[ich].infeasEdWt;
    double infeasMerit = infeasValue / infeasEdWt;
    if (bestMerit < infeasMerit) {
      bestMerit = infeasMerit;
      multi_iChoice = ich;
    }
  }

  /**
   * 2. Obtain other info for current sub-optimization choice
   */
  row_out = kNoRowChosen;
  if (multi_iChoice != -1) {
    MChoice* workChoice = &multi_choice[multi_iChoice];

    // Assign useful variables
    row_out = workChoice->row_out;
    variable_out = ekk_instance_.basis_.basicIndex_[row_out];
    double valueOut = workChoice->baseValue;
    double lowerOut = workChoice->baseLower;
    double upperOut = workChoice->baseUpper;
    delta_primal = valueOut - (valueOut < lowerOut ? lowerOut : upperOut);
    move_out = delta_primal < 0 ? -1 : 1;

    // Assign buffers
    MFinish* finish = &multi_finish[multi_nFinish];
    finish->row_out = row_out;
    finish->variable_out = variable_out;
    finish->row_ep = &workChoice->row_ep;
    finish->col_aq = &workChoice->col_aq;
    finish->col_BFRT = &workChoice->col_BFRT;
    // Save the edge weight - over-written later when using Devex
    finish->EdWt = workChoice->infeasEdWt;

    // Disable current row
    workChoice->row_out = kNoRowChosen;
  }
}